

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

SmallBuffer * __thiscall
helics::SmallBuffer::operator=
          (SmallBuffer *this,basic_string_view<char,_std::char_traits<char>_> *u)

{
  byte *pbVar1;
  size_type sVar2;
  const_pointer __src;
  size_t *in_RSI;
  SmallBuffer *in_RDI;
  string_view val;
  size_t in_stack_ffffffffffffffb8;
  SmallBuffer *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  
  local_28[0]._M_len = *in_RSI;
  local_28[0]._M_str = (char *)in_RSI[1];
  pbVar1 = (byte *)CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(local_28);
  if (pbVar1 == in_RDI->heap) {
    sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
    in_RDI->bufferSize = sVar2;
  }
  else {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
    resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
    if (sVar2 != 0) {
      pbVar1 = in_RDI->heap;
      __src = CLI::std::basic_string_view<char,_std::char_traits<char>_>::data(local_28);
      sVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
      memcpy(pbVar1,__src,sVar2);
    }
  }
  return in_RDI;
}

Assistant:

SmallBuffer& operator=(U&& u)
    {
        std::string_view val(std::forward<U>(u));
        if (reinterpret_cast<const std::byte*>(val.data()) == heap) {
            bufferSize = val.size();
            return *this;
        }
        resize(val.size());
        if (val.size() > 0) {
            std::memcpy(heap, val.data(), val.size());
        }
        return *this;
    }